

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void add_range_closed_at(roaring64_bitmap_t *r,art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  art_val_t *paVar1;
  container_t *pcVar2;
  container_t *pcVar3;
  art_t *art_00;
  art_key_chunk_t *key;
  undefined2 in_CX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  container_t *in_RDI;
  undefined2 in_R8W;
  leaf_t new_leaf;
  container_t *container;
  uint8_t typecode;
  container_t *container2;
  uint8_t typecode2;
  container_t *container1;
  uint8_t typecode1;
  leaf_t *leaf;
  undefined7 in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  roaring64_bitmap_t *in_stack_ffffffffffffffa0;
  leaf_t *in_stack_ffffffffffffffa8;
  roaring64_bitmap_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t max_00;
  
  max_00 = (uint32_t)((ulong)in_RDX >> 0x20);
  paVar1 = art_find((art_t *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    (art_key_chunk_t *)0x13cd80);
  if (paVar1 == (art_val_t *)0x0) {
    art_00 = (art_t *)container_range_of_ones
                                ((uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffa8,
                                 (uint8_t *)in_stack_ffffffffffffffa0);
    key = (art_key_chunk_t *)
          add_container(in_stack_ffffffffffffffb0,art_00,
                        (uint8_t)((ulong)in_stack_ffffffffffffffa0 >> 0x38));
    art_insert(art_00,key,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  else {
    get_typecode(*paVar1);
    pcVar2 = get_container(in_stack_ffffffffffffffa0,
                           CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    pcVar3 = container_add_range(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38),(uint32_t)in_RSI,max_00,
                                 (uint8_t *)
                                 CONCAT26(in_CX,CONCAT24(in_R8W,in_stack_ffffffffffffffe0)));
    if (pcVar3 != pcVar2) {
      container_free(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
      replace_container(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    }
  }
  return;
}

Assistant:

static inline void add_range_closed_at(roaring64_bitmap_t *r, art_t *art,
                                       uint8_t *high48, uint16_t min,
                                       uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf != NULL) {
        uint8_t typecode1 = get_typecode(*leaf);
        container_t *container1 = get_container(r, *leaf);
        uint8_t typecode2;
        container_t *container2 =
            container_add_range(container1, typecode1, min, max, &typecode2);
        if (container2 != container1) {
            container_free(container1, typecode1);
            replace_container(r, leaf, container2, typecode2);
        }
        return;
    }
    uint8_t typecode;
    // container_add_range is inclusive, but `container_range_of_ones` is
    // exclusive.
    container_t *container = container_range_of_ones(min, max + 1, &typecode);
    leaf_t new_leaf = add_container(r, container, typecode);
    art_insert(art, high48, (art_val_t)new_leaf);
}